

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O2

void gdImageGifAnimBeginCtx(gdImagePtr im,gdIOCtxPtr out,int GlobalCM,int Loops)

{
  int w;
  int w_00;
  byte bVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = colorstobpp(im->colorsTotal);
  w = im->sx;
  w_00 = im->sy;
  gdPutBuf("GIF89a",6,out);
  gifPutWord(w,out);
  gifPutWord(w_00,out);
  bVar1 = (byte)iVar2 - 1;
  gdPutC(bVar1 * '\x10' | (GlobalCM != 0) << 7 | bVar1,out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  if (GlobalCM != 0) {
    for (lVar3 = 0; (uint)lVar3 >> ((byte)iVar2 & 0x1f) == 0; lVar3 = lVar3 + 1) {
      gdPutC((uchar)im->red[lVar3],out);
      gdPutC((uchar)im->green[lVar3],out);
      gdPutC((uchar)im->blue[lVar3],out);
    }
  }
  if (-1 < Loops) {
    gdPutBuf(anon_var_dwarf_e33f,0x10,out);
    gifPutWord(Loops,out);
    gdPutC('\0',out);
    return;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifAnimBeginCtx(gdImagePtr im, gdIOCtxPtr out, int GlobalCM, int Loops)
{
	int B;
	int RWidth, RHeight;
	int Resolution;
	int ColorMapSize;
	int BitsPerPixel;
	int Background = 0;
	int i;

	/* Default is to use global color map */
	if (GlobalCM < 0) {
		GlobalCM = 1;
	}

	BitsPerPixel = colorstobpp(im->colorsTotal);
	ColorMapSize = 1 << BitsPerPixel;

	RWidth = im->sx;
	RHeight = im->sy;

	Resolution = BitsPerPixel;

	/* Write the Magic header */
	gdPutBuf("GIF89a", 6, out);

	/* Write out the screen width and height */
	gifPutWord(RWidth, out);
	gifPutWord(RHeight, out);

	/* Indicate that there is a global colour map */
	B = GlobalCM ? 0x80 : 0;

	/* OR in the resolution */
	B |= (Resolution - 1) << 4;

	/* OR in the Bits per Pixel */
	B |= (BitsPerPixel - 1);

	/* Write it out */
	gdPutC(B, out);

	/* Write out the Background colour */
	gdPutC(Background, out);

	/* Byte of 0's (future expansion) */
	gdPutC(0, out);

	/* Write out the Global Colour Map */
	if(GlobalCM) {
		for(i = 0; i < ColorMapSize; ++i) {
			gdPutC(im->red[i], out);
			gdPutC(im->green[i], out);
			gdPutC(im->blue[i], out);
		}
	}

	if(Loops >= 0) {
		gdPutBuf("!\377\13NETSCAPE2.0\3\1", 16, out);
		gifPutWord(Loops, out);
		gdPutC(0, out);
	}
}